

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

ll_node * cli_parse_args(int argc,char **argv,char *prefix)

{
  ll_node *plVar1;
  ll_node *local_48;
  ll_node *cur_node;
  ll_node *prev_node;
  ll_node *root_node;
  int end;
  int pos;
  char *prefix_local;
  char **argv_local;
  ll_node *plStack_10;
  int argc_local;
  
  root_node._4_4_ = 1;
  prev_node = (ll_node *)0x0;
  local_48 = (ll_node *)0x0;
  if ((argc < 1) ||
     (_end = prefix, prefix_local = (char *)argv, argv_local._4_4_ = argc, argv == (char **)0x0)) {
    plStack_10 = (ll_node *)0x0;
  }
  else {
    while ((root_node._4_4_ < argv_local._4_4_ &&
           (root_node._0_4_ = root_node._4_4_,
           plVar1 = parse_arg_range(root_node._4_4_,argv_local._4_4_,(int *)&root_node,
                                    (char **)prefix_local,_end), plVar1 != (ll_node *)0x0))) {
      if (prev_node == (ll_node *)0x0) {
        prev_node = plVar1;
      }
      if (local_48 != (ll_node *)0x0) {
        local_48->next = plVar1;
      }
      root_node._4_4_ = (int)root_node;
      local_48 = plVar1;
    }
    plStack_10 = prev_node;
  }
  return plStack_10;
}

Assistant:

struct ll_node *cli_parse_args(int argc, const char *argv[], const char *prefix)
{
	int pos = 1;
	int end = pos;
	struct ll_node *root_node = NULL;
	struct ll_node *prev_node = NULL;
	struct ll_node *cur_node = NULL;

	if (argc <= 0 || argv == NULL) {
		return NULL;
	}
	while (pos < argc) {
		prev_node = cur_node;
		cur_node = parse_arg_range(pos, argc, &end, argv, prefix);
		if (cur_node == NULL) {
			break;
		}
		if (root_node == NULL) {
			root_node = cur_node;
		}
		if (prev_node != NULL) {
			prev_node->next = cur_node;
		}
		pos = end;
	}
	return root_node;
}